

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

int resolveLocal(Compiler *compiler,Token *name)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  
  uVar4 = (ulong)compiler->localCount;
  if (0 < (long)uVar4) {
    iVar3 = name->length;
    piVar5 = &compiler->locals[uVar4 - 1].depth;
    do {
      if ((iVar3 == piVar5[-2]) &&
         (iVar2 = bcmp(name->start,*(char **)(piVar5 + -4),(long)iVar3), iVar2 == 0)) {
        iVar3 = (int)uVar4 + -1;
        if (*piVar5 != -1) {
          return iVar3;
        }
        errorAt(&parser.previous,"Cannot read local variable in its own initializer.");
        return iVar3;
      }
      piVar5 = piVar5 + -8;
      bVar1 = 1 < uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar1);
  }
  return -1;
}

Assistant:

static int resolveLocal(Compiler *compiler, Token *name) {
    for (int i = compiler->localCount - 1; i >= 0; i--) {
        Local *local = &compiler->locals[i];
        if (identifiersEqual(name, &local->name)) {
            if (local->depth == -1) {
                error("Cannot read local variable in its own initializer.");
            }
            return i;
        }
    }

    return -1;
}